

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  cmLinkImplementation *pcVar4;
  char *pcVar5;
  cmLinkImplItem *lib;
  pointer item;
  string *li;
  __node_base _Var6;
  pointer pbVar7;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  cmTargetSelectLinker tsl;
  string propagates;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  cmTargetCollectLinkLanguages cll;
  undefined1 local_178 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  cmTargetCollectLinkLanguages local_98;
  
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  pcVar4 = GetLinkImplementation(this,config);
  if (pcVar4 != (cmLinkImplementation *)0x0) {
    pbVar1 = (pcVar4->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pcVar4->Languages).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&local_f0,pbVar7);
    }
    std::__cxx11::string::string((string *)&local_110,(string *)config);
    cmTargetCollectLinkLanguages::cmTargetCollectLinkLanguages
              (&local_98,this,&local_110,
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f0,this);
    std::__cxx11::string::~string((string *)&local_110);
    pcVar2 = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (item = (pcVar4->super_cmLinkImplementationLibraries).Libraries.
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start; item != pcVar2; item = item + 1) {
      cmTargetCollectLinkLanguages::Visit(&local_98,&item->super_cmLinkItem);
    }
    for (_Var6._M_nxt = local_f0._M_before_begin._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
        _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&lc->Languages,(value_type *)(_Var6._M_nxt + 1));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_178,"HAS_CXX",(allocator<char> *)&local_130);
    pcVar5 = GetProperty(this,(string *)local_178);
    std::__cxx11::string::~string((string *)local_178);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_178,"LINKER_LANGUAGE",(allocator<char> *)&local_130);
      pcVar5 = GetProperty(this,(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      if (pcVar5 == (char *)0x0) {
        local_160._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_160._M_impl.super__Rb_tree_header._M_header;
        local_178._0_4_ = 0;
        local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_178._16_8_ = this->LocalGenerator->GlobalGenerator;
        pbVar1 = (pcVar4->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_178._8_8_ = this;
        local_160._M_impl.super__Rb_tree_header._M_header._M_right =
             local_160._M_impl.super__Rb_tree_header._M_header._M_left;
        for (pbVar7 = (pcVar4->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
            pbVar7 = pbVar7 + 1) {
          cmTargetSelectLinker::Consider
                    ((cmTargetSelectLinker *)local_178,(pbVar7->_M_dataplus)._M_p);
        }
        for (_Var6._M_nxt = local_f0._M_before_begin._M_nxt; _Var6._M_nxt != (_Hash_node_base *)0x0;
            _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
          std::operator+(&local_b8,"CMAKE_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var6._M_nxt + 1));
          std::operator+(&local_130,&local_b8,"_LINKER_PREFERENCE_PROPAGATES");
          std::__cxx11::string::~string((string *)&local_b8);
          bVar3 = cmMakefile::IsOn(this->Makefile,&local_130);
          if (bVar3) {
            cmTargetSelectLinker::Consider
                      ((cmTargetSelectLinker *)local_178,
                       (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (_Var6._M_nxt + 1))->_M_dataplus)._M_p);
          }
          std::__cxx11::string::~string((string *)&local_130);
        }
        cmTargetSelectLinker::Choose_abi_cxx11_(&local_130,(cmTargetSelectLinker *)local_178);
        std::__cxx11::string::operator=((string *)lc,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_160);
      }
      else {
        std::__cxx11::string::assign((char *)lc);
      }
    }
    else {
      std::__cxx11::string::assign((char *)lc);
    }
    cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(&local_98);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_f0);
    return;
  }
  __assert_fail("impl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                ,0x883,
                "void cmGeneratorTarget::ComputeLinkClosure(const std::string &, LinkClosure &) const"
               );
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  // Get languages built in this target.
  std::unordered_set<std::string> languages;
  cmLinkImplementation const* impl = this->GetLinkImplementation(config);
  assert(impl);
  for (std::string const& li : impl->Languages) {
    languages.insert(li);
  }

  // Add interface languages from linked targets.
  cmTargetCollectLinkLanguages cll(this, config, languages, this);
  for (cmLinkImplItem const& lib : impl->Libraries) {
    cll.Visit(lib);
  }

  // Store the transitive closure of languages.
  for (std::string const& lang : languages) {
    lc.Languages.push_back(lang);
  }

  // Choose the language whose linker should be used.
  if (this->GetProperty("HAS_CXX")) {
    lc.LinkerLanguage = "CXX";
  } else if (const char* linkerLang = this->GetProperty("LINKER_LANGUAGE")) {
    lc.LinkerLanguage = linkerLang;
  } else {
    // Find the language with the highest preference value.
    cmTargetSelectLinker tsl(this);

    // First select from the languages compiled directly in this target.
    for (std::string const& l : impl->Languages) {
      tsl.Consider(l.c_str());
    }

    // Now consider languages that propagate from linked targets.
    for (std::string const& lang : languages) {
      std::string propagates =
        "CMAKE_" + lang + "_LINKER_PREFERENCE_PROPAGATES";
      if (this->Makefile->IsOn(propagates)) {
        tsl.Consider(lang.c_str());
      }
    }

    lc.LinkerLanguage = tsl.Choose();
  }
}